

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolverTypes.h
# Opt level: O0

void __thiscall
Minisat::Clause::Clause(Clause *this,vec<Minisat::Lit,_int> *ps,bool use_extra,bool learnt)

{
  Size SVar1;
  Lit *pLVar2;
  byte in_CL;
  byte in_DL;
  vec<Minisat::Lit,_int> *in_RSI;
  uint *in_RDI;
  int i;
  int local_18;
  
  *in_RDI = *in_RDI & 0xfffffffc;
  *in_RDI = *in_RDI & 0xfffffffb | (uint)(in_CL & 1) << 2;
  *in_RDI = *in_RDI & 0xfffffff7 | (uint)(in_DL & 1) << 3;
  *in_RDI = *in_RDI & 0xffffffef;
  SVar1 = vec<Minisat::Lit,_int>::size(in_RSI);
  *in_RDI = *in_RDI & 0x1f | SVar1 << 5;
  for (local_18 = 0; SVar1 = vec<Minisat::Lit,_int>::size(in_RSI), local_18 < SVar1;
      local_18 = local_18 + 1) {
    pLVar2 = vec<Minisat::Lit,_int>::operator[](in_RSI,local_18);
    in_RDI[(long)local_18 + 1] = pLVar2->x;
  }
  if ((*in_RDI >> 3 & 1) != 0) {
    if ((*in_RDI >> 2 & 1) == 0) {
      calcAbstraction((Clause *)in_RSI);
    }
    else {
      in_RDI[(ulong)(*in_RDI >> 5) + 1] = 0;
    }
  }
  return;
}

Assistant:

Clause(const vec<Lit>& ps, bool use_extra, bool learnt) {
        header.mark      = 0;
        header.learnt    = learnt;
        header.has_extra = use_extra;
        header.reloced   = 0;
        header.size      = ps.size();

        for (int i = 0; i < ps.size(); i++) 
            data[i].lit = ps[i];

        if (header.has_extra){
            if (header.learnt)
                data[header.size].act = 0;
            else
                calcAbstraction();
    }
    }